

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

string * __thiscall
units::to_string_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_measurement *measure,
          uint64_t match_flags)

{
  byte bVar1;
  precise_unit *un;
  string str;
  stringstream ss;
  string local_1d0;
  undefined8 local_1b0;
  undefined8 local_1a8;
  long local_1a0;
  undefined8 uStack_198;
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0);
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a0 + -0x18)) = 0xc;
  std::ostream::_M_insert<double>(*(double *)this);
  local_1d0._M_dataplus._M_p._0_1_ = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(local_190,(char *)&local_1d0,1);
  local_1b0 = *(undefined8 *)(this + 8);
  local_1a8 = *(undefined8 *)(this + 0x10);
  to_string_abi_cxx11_(&local_1d0,(units *)&local_1b0,un,match_flags);
  bVar1 = *(byte *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_);
  if (((byte)(bVar1 - 0x30) < 10) ||
     ((bVar1 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)))) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              (&local_1d0,0,0,1,'(');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_1d0,')');
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,
             (char *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_),
             local_1d0._M_string_length);
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_) !=
      &local_1d0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_),
                    local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string
    to_string(const precise_measurement& measure, std::uint64_t match_flags)
{
    std::stringstream ss;
    ss.precision(12);
    ss << measure.value();
    ss << ' ';
    auto str = to_string(measure.units(), match_flags);
    if (isNumericalStartCharacter(str.front())) {
        str.insert(str.begin(), '(');
        str.push_back(')');
    }
    ss << str;
    return ss.str();
}